

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::PopAndCheck3Types
          (TypeChecker *this,Type expected1,Type expected2,Type expected3,char *desc)

{
  Result RVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Type local_54;
  Type local_50;
  Type local_4c;
  char *pcStack_48;
  Type actual;
  Type local_40;
  Type local_3c;
  Type local_38;
  byte local_31;
  
  local_4c = Any;
  pcStack_48 = desc;
  local_3c = expected1;
  RVar1 = PeekType(this,0,&local_4c);
  bVar3 = local_4c != expected3;
  bVar4 = local_4c != Any;
  local_31 = RVar1.enum_ == Error;
  local_50 = Any;
  local_40 = expected3;
  RVar1 = PeekType(this,1,&local_50);
  bVar5 = local_50 != expected2;
  bVar6 = local_50 != Any;
  bVar2 = RVar1.enum_ == Error | local_31;
  local_54 = Any;
  local_38 = expected2;
  RVar1 = PeekType(this,2,&local_54);
  bVar2 = (RVar1.enum_ == Error || (bVar6 && expected2 != Any) && bVar5) |
          bVar2 | ((bVar4 && expected3 != Any) && bVar3) |
          ((local_54 != Any && local_3c != Any) && local_54 != local_3c);
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
            (this,(Result)(bVar2 & Error),pcStack_48,local_3c,local_38,local_40);
  RVar1 = DropTypes(this,3);
  return (Result)((bVar2 | RVar1.enum_ == Error) & Error);
}

Assistant:

Result TypeChecker::PopAndCheck3Types(Type expected1,
                                      Type expected2,
                                      Type expected3,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected3);
  result |= PeekAndCheckType(1, expected2);
  result |= PeekAndCheckType(2, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2, expected3);
  result |= DropTypes(3);
  return result;
}